

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::SFML::SetJoystickLStickThreshold(float threshold)

{
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x25c,"void ImGui::SFML::SetJoystickLStickThreshold(float)");
  }
  if ((0.0 <= threshold) && (threshold <= 100.0)) {
    *(float *)((anonymous_namespace)::s_currWindowCtx + 0xc0) = threshold;
    return;
  }
  __assert_fail("threshold >= 0.f && threshold <= 100.f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,0x25d,"void ImGui::SFML::SetJoystickLStickThreshold(float)");
}

Assistant:

void SetJoystickLStickThreshold(float threshold) {
    assert(s_currWindowCtx);
    assert(threshold >= 0.f && threshold <= 100.f);
    s_currWindowCtx->lStickInfo.threshold = threshold;
}